

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_set.c
# Opt level: O3

int mpt_color_pset(mpt_color *col,mpt_convertable *src)

{
  int iVar1;
  uint uVar2;
  char *in_RAX;
  char *txt;
  char *local_18;
  
  if (src == (mpt_convertable *)0x0) {
    return (uint)(*col != (mpt_color)0xff);
  }
  local_18 = in_RAX;
  if (mpt_color_typeid::ptype == 0) {
    iVar1 = mpt_type_basic_add(4);
    if (iVar1 < 1) goto LAB_00106459;
  }
  else {
    iVar1 = mpt_color_typeid::ptype;
    if (mpt_color_typeid::ptype < 1) goto LAB_00106459;
  }
  mpt_color_typeid::ptype = iVar1;
  iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)mpt_color_typeid::ptype,col);
  if (-1 < iVar1) {
    return 0;
  }
LAB_00106459:
  iVar1 = (*src->_vptr->convert)(src,0x73,&local_18);
  if (iVar1 < 0) {
    uVar2 = 0xfffffffd;
  }
  else {
    iVar1 = mpt_color_parse(col,local_18);
    uVar2 = iVar1 >> 0x1f & 0xfffffffe;
  }
  return uVar2;
}

Assistant:

extern int mpt_color_pset(MPT_STRUCT(color) *col, MPT_INTERFACE(convertable) *src)
{
	const char *txt;
	int type;
	int len;
	
	if (!src) {
		/* default color is black, no transparency */
		static const MPT_STRUCT(color) tcol = MPT_COLOR_INIT;
		return memcmp(&tcol, col, sizeof(*col)) ? 1 : 0;
	}
	if ((type = mpt_color_typeid()) > 0
	 && (len = src->_vptr->convert(src, type, col)) >= 0) {
		return 0;
	}
	/* parse color name/format  */
	if ((len = src->_vptr->convert(src, 's', &txt)) >= 0) {
		int take;
		if ((take = mpt_color_parse(col, txt)) < 0) {
			return MPT_ERROR(BadValue);
		}
		return 0;
	}
	return MPT_ERROR(BadType);
}